

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_json.c
# Opt level: O2

json_value * json_parse_ex(json_settings *settings,char *json,size_t length,char *error_buf)

{
  json_type jVar1;
  json_value *pjVar2;
  double dVar3;
  ushort uVar4;
  bool bVar5;
  _func_void_void_ptr_void_ptr *p_Var6;
  void *pvVar7;
  uchar uVar8;
  uchar uVar9;
  byte bVar10;
  int iVar11;
  ushort **ppuVar12;
  long lVar13;
  anon_union_8_2_291a86ad_for__reserved *paVar14;
  json_value **ppjVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  byte *pbVar19;
  char *pcVar20;
  byte bVar21;
  uint uVar22;
  _json_value *p_Var23;
  uint uVar24;
  json_value *pjVar25;
  uint uVar26;
  byte *pbVar27;
  uint uVar28;
  _json_value *local_198;
  json_value *local_188;
  long local_180;
  ulong local_178;
  json_value *local_170;
  json_state local_168;
  json_value *local_100;
  json_value *local_f8;
  long local_f0;
  long local_e8;
  double local_e0;
  uint local_d4;
  byte *local_d0;
  byte *local_c8;
  char *local_c0;
  char error [128];
  
  local_100 = (json_value *)0x0;
  local_168.cur_line = 0;
  local_168.cur_col = 0;
  local_168.first_pass = 0;
  local_168._76_4_ = 0;
  local_168.used_memory = 0;
  if ((((2 < length) && (*json == -0x11)) && (json[1] == -0x45)) && (json[2] == -0x41)) {
    json = json + 3;
    length = length - 3;
  }
  error._0_8_ = error._0_8_ & 0xffffffffffffff00;
  local_168.settings.max_memory = settings->max_memory;
  local_168.settings._8_8_ = *(undefined8 *)&settings->settings;
  local_168.settings.memory_alloc = settings->memory_alloc;
  local_168.settings.memory_free = settings->memory_free;
  local_168.settings.user_data = settings->user_data;
  local_168.settings.value_extra = settings->value_extra;
  if (local_168.settings.memory_alloc == (_func_void_ptr_size_t_int_void_ptr *)0x0) {
    local_168.settings.memory_alloc = default_alloc;
  }
  pbVar19 = (byte *)json + length;
  if (local_168.settings.memory_free == (_func_void_void_ptr_void_ptr *)0x0) {
    local_168.settings.memory_free = default_free;
  }
  local_168.uint_max = 0xfffffff7;
  local_168._12_4_ = 0;
  local_168.ulong_max = 0xfffffffffffffff7;
  local_c8 = pbVar19 + -1;
  iVar11 = 1;
  local_180 = 0;
  local_f0 = 0;
  local_e8 = 0;
  local_d0 = (byte *)json;
  local_c0 = error_buf;
  do {
    uVar24 = 8;
    bVar5 = false;
    local_168.first_pass = iVar11;
    if (iVar11 < 0) {
      return local_100;
    }
    local_170 = (json_value *)0x0;
    local_188 = (json_value *)0x0;
    local_168.cur_line = 1;
    local_198 = (_json_value *)0x0;
    uVar18 = 0;
    pbVar27 = local_d0;
LAB_0012e8b1:
    uVar26 = (uint)uVar18;
    local_168.ptr = (char *)pbVar27;
    if (pbVar27 == pbVar19) {
      if ((uVar24 & 0x20) == 0) {
        uVar28 = 0;
        goto LAB_0012e915;
      }
LAB_0012f771:
      uVar17 = local_168._88_8_ & 0xffffffff;
      uVar18 = (ulong)local_168.cur_col;
      pcVar20 = "Unexpected EOF in string (at %d:%d)";
      goto LAB_0012f79f;
    }
    bVar10 = *pbVar27;
    uVar28 = (uint)bVar10;
    if ((uVar24 & 0x20) != 0) {
      if (bVar10 == 0) goto LAB_0012f771;
      if (local_168.uint_max < uVar26) {
LAB_0012f789:
        uVar17 = local_168._88_8_ & 0xffffffff;
        uVar18 = (ulong)local_168._88_8_ >> 0x20;
        pcVar20 = "%d:%d: Too long (caught overflow)";
LAB_0012f79f:
        snprintf(error,0x80,pcVar20,uVar17,uVar18);
        goto LAB_0012f7b3;
      }
      uVar17 = uVar18 & 0xffffffff;
      if ((uVar24 & 0x10) == 0) {
        if (bVar10 == 0x22) {
          if (local_168.first_pass == 0) {
            *(undefined1 *)((long)&local_198->parent + uVar17) = 0;
          }
          uVar24 = uVar24 & 0xffffffcf;
          if (local_188->type != json_object) {
            uVar28 = 0x22;
            if (local_188->type == json_string) {
              (local_188->u).string.length = uVar26;
              bVar5 = true;
            }
            local_198 = (_json_value *)0x0;
            goto LAB_0012e915;
          }
          if (local_168.first_pass == 0) {
            *(anon_union_8_2_291a86ad_for__reserved *)
             ((local_188->u).string.ptr + (ulong)(local_188->u).string.length * 0x18) =
                 local_188->_reserved;
            paVar14 = &local_188->_reserved;
            (local_188->u).object.values[(local_188->u).string.length].name_length = uVar26;
          }
          else {
            paVar14 = (anon_union_8_2_291a86ad_for__reserved *)&(local_188->u).object.values;
          }
          paVar14->next_alloc =
               (_json_value *)((long)&paVar14->next_alloc->parent + (ulong)(uVar26 + 1));
          uVar24 = uVar24 | 0x48;
          local_198 = (_json_value *)0x0;
        }
        else {
          if (bVar10 != 0x5c) goto switchD_0012ea51_caseD_6f;
          uVar24 = uVar24 | 0x10;
        }
        goto LAB_0012f01c;
      }
      uVar24 = uVar24 & 0xffffffef;
      switch(bVar10) {
      case 0x6e:
        if (local_168.first_pass == 0) {
          *(undefined1 *)((long)&local_198->parent + uVar17) = 10;
        }
        break;
      case 0x6f:
      case 0x70:
      case 0x71:
      case 0x73:
switchD_0012ea51_caseD_6f:
        if (local_168.first_pass == 0) {
          *(byte *)((long)&local_198->parent + uVar17) = bVar10;
        }
        break;
      case 0x72:
        if (local_168.first_pass == 0) {
          *(undefined1 *)((long)&local_198->parent + uVar17) = 0xd;
        }
        break;
      case 0x74:
        if (local_168.first_pass == 0) {
          *(undefined1 *)((long)&local_198->parent + uVar17) = 9;
        }
        break;
      case 0x75:
        local_178 = uVar18;
        if (3 < (long)pbVar19 - (long)pbVar27) {
          local_168.ptr = (char *)(pbVar27 + 1);
          uVar8 = hex_value(pbVar27[1]);
          if (uVar8 != 0xff) {
            local_168.ptr = (char *)(pbVar27 + 2);
            uVar9 = hex_value(pbVar27[2]);
            local_f8 = (json_value *)CONCAT71(local_f8._1_7_,uVar9);
            if (uVar9 != 0xff) {
              local_168.ptr = (char *)(pbVar27 + 3);
              uVar9 = hex_value(pbVar27[3]);
              if (uVar9 != 0xff) {
                local_168.ptr = (char *)(pbVar27 + 4);
                bVar10 = hex_value(pbVar27[4]);
                if (bVar10 != 0xff) {
                  bVar21 = uVar8 << 4 | (byte)local_f8;
                  bVar10 = bVar10 | uVar9 << 4;
                  uVar4 = CONCAT11(bVar21,bVar10);
                  uVar26 = (uint)uVar4;
                  if ((byte)(uVar8 << 4 | (byte)local_f8 & 0xf8) != 0xd8) {
                    if (uVar26 < 0x80) {
                      uVar18 = local_178;
                      if (local_168.first_pass == 0) {
                        *(byte *)((long)&local_198->parent + uVar17) = bVar10;
                      }
                      break;
                    }
                    iVar11 = (int)local_178;
                    if (bVar21 < 8) {
                      if (local_168.first_pass == 0) {
                        *(byte *)((long)&local_198->parent + uVar17) = (byte)(uVar4 >> 6) | 0xc0;
                        *(byte *)((long)&local_198->parent + (ulong)(iVar11 + 1)) =
                             bVar10 & 0x3f | 0x80;
                        uVar18 = (ulong)(iVar11 + 2);
                      }
                      else {
                        uVar18 = (ulong)(iVar11 + 2);
                      }
                    }
                    else if (local_168.first_pass == 0) {
                      *(byte *)((long)&local_198->parent + uVar17) = bVar21 >> 4 | 0xe0;
                      *(byte *)((long)&local_198->parent + (ulong)(iVar11 + 1)) =
                           (byte)(uVar4 >> 6) & 0x3f | 0x80;
                      *(byte *)((long)&local_198->parent + (ulong)(iVar11 + 2)) =
                           bVar10 & 0x3f | 0x80;
                      uVar18 = (ulong)(iVar11 + 3);
                    }
                    else {
                      uVar18 = (ulong)(iVar11 + 3);
                    }
                    goto LAB_0012f01c;
                  }
                  local_e0 = (double)CONCAT71(local_e0._1_7_,bVar10);
                  local_d4 = uVar26;
                  if (((5 < (long)pbVar19 - (long)(pbVar27 + 4)) &&
                      (local_168.ptr = (char *)(pbVar27 + 5), pbVar27[5] == 0x5c)) &&
                     (local_168.ptr = (char *)(pbVar27 + 6), pbVar27[6] == 0x75)) {
                    local_168.ptr = (char *)(pbVar27 + 7);
                    uVar8 = hex_value(pbVar27[7]);
                    if (uVar8 != 0xff) {
                      local_168.ptr = (char *)(pbVar27 + 8);
                      bVar10 = hex_value(pbVar27[8]);
                      if (bVar10 != 0xff) {
                        local_168.ptr = (char *)(pbVar27 + 9);
                        uVar8 = hex_value(pbVar27[9]);
                        if (uVar8 != 0xff) {
                          local_168.ptr = (char *)(pbVar27 + 10);
                          bVar21 = hex_value(pbVar27[10]);
                          if (bVar21 != 0xff) {
                            iVar11 = (int)local_178;
                            if (local_168.first_pass == 0) {
                              bVar21 = bVar21 | uVar8 << 4;
                              *(byte *)((long)&local_198->parent + uVar17) =
                                   (byte)local_f8 & 3 | 0xf0;
                              *(byte *)((long)&local_198->parent + (ulong)(iVar11 + 1)) =
                                   local_e0._0_1_ >> 2 | 0x90;
                              *(byte *)((long)&local_198->parent + (ulong)(iVar11 + 2)) =
                                   (byte)(((bVar10 & 3) << 8 | (uint)bVar21 | local_d4 << 10) >> 6)
                                   & 0x3f | 0x80;
                              *(byte *)((long)&local_198->parent + (ulong)(iVar11 + 3)) =
                                   bVar21 & 0x3f | 0x80;
                            }
                            uVar18 = (ulong)(iVar11 + 4);
                            goto LAB_0012f01c;
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
        pcVar20 = "Invalid character value `%c` (at %d:%d)";
        uVar18 = 0x75;
        uVar24 = local_168.cur_line;
        uVar26 = local_168.cur_col;
LAB_0012f875:
        uVar17 = (ulong)uVar24;
        goto LAB_0012f8bd;
      default:
        if (bVar10 == 0x66) {
          if (local_168.first_pass == 0) {
            *(undefined1 *)((long)&local_198->parent + uVar17) = 0xc;
          }
        }
        else {
          if (bVar10 != 0x62) goto switchD_0012ea51_caseD_6f;
          if (local_168.first_pass == 0) {
            *(undefined1 *)((long)&local_198->parent + uVar17) = 8;
          }
        }
      }
      uVar18 = (ulong)((int)uVar18 + 1);
LAB_0012f01c:
      pbVar27 = (byte *)(local_168.ptr + 1);
      goto LAB_0012e8b1;
    }
LAB_0012e915:
    bVar10 = (byte)uVar28;
    if ((local_168.settings._8_8_ & 1) != 0) {
      if ((uVar24 & 0x6000) != 0) {
        if ((uVar24 >> 0xd & 1) == 0) {
          if ((uVar24 >> 0xe & 1) == 0) goto LAB_0012e924;
          if (bVar10 == 0x2a) {
            if ((pbVar27 < local_c8) && (pbVar27[1] == 0x2f)) {
              uVar24 = uVar24 & 0xffff9fff;
              local_168.ptr = (char *)(pbVar27 + 1);
            }
          }
          else if (uVar28 == 0) {
            uVar17 = local_168._88_8_ & 0xffffffff;
            uVar18 = (ulong)local_168.cur_col;
            pcVar20 = "%d:%d: Unexpected EOF in block comment";
            goto LAB_0012f79f;
          }
        }
        else if ((bVar10 < 0xe) && ((0x2401U >> (uVar28 & 0x1f) & 1) != 0)) {
          uVar24 = uVar24 & 0xffffdfff;
          local_168.ptr = (char *)(pbVar27 + -1);
        }
        goto LAB_0012f01c;
      }
      if (bVar10 != 0x2f) goto LAB_0012e924;
      if (((uVar24 & 0x88) == 0) && (local_188->type != json_object)) {
        uVar17 = local_168._88_8_ & 0xffffffff;
        uVar18 = (ulong)local_168.cur_col;
        pcVar20 = "%d:%d: Comment not allowed here";
      }
      else {
        local_168.ptr = (char *)(pbVar27 + 1);
        if ((byte *)local_168.ptr != pbVar19) {
          bVar10 = *local_168.ptr;
          if (bVar10 == 0x2a) {
            uVar24 = uVar24 | 0x4000;
          }
          else {
            if (bVar10 != 0x2f) {
              uVar18 = local_168._88_8_ & 0xffffffff;
              pcVar20 = "%d:%d: Unexpected `%c` in comment opening sequence";
              uVar24 = local_168.cur_col;
              uVar26 = (int)(char)bVar10;
              goto LAB_0012f875;
            }
            uVar24 = uVar24 | 0x2000;
          }
          goto LAB_0012f01c;
        }
        uVar17 = local_168._88_8_ & 0xffffffff;
        uVar18 = (ulong)local_168.cur_col;
        pcVar20 = "%d:%d: EOF unexpected";
      }
      goto LAB_0012f79f;
    }
LAB_0012e924:
    uVar26 = (uint)(char)bVar10;
    if (-1 < bVar5) {
      if ((uVar24 & 8) == 0) {
        jVar1 = local_188->type;
        uVar22 = uVar24;
        if (1 < jVar1 - json_integer) {
          if (jVar1 != json_object) goto LAB_0012f24a;
          if (bVar10 == 9) goto LAB_0012f01c;
          if (uVar28 == 0x7d) goto LAB_0012eea9;
          if ((uVar28 == 0xd) || (uVar28 == 0x20)) goto LAB_0012f01c;
          if (uVar28 == 0x22) {
            if ((uVar24 & 4) != 0) {
              uVar17 = local_168._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_168.cur_col;
              pcVar20 = "%d:%d: Expected , before \"";
              goto LAB_0012f79f;
            }
            uVar22 = uVar24 | 0x20;
            local_198 = (local_188->_reserved).next_alloc;
            uVar18 = 0;
            goto LAB_0012f24a;
          }
          if (uVar28 == 0x2c) {
            if ((uVar24 & 4) != 0) {
              uVar22 = uVar24 & 0xffffff73;
              goto LAB_0012f24a;
            }
          }
          else if (uVar28 == 10) goto LAB_0012eafa;
          uVar18 = local_168._88_8_ & 0xffffffff;
          uVar17 = (ulong)local_168.cur_col;
          pcVar20 = "%d:%d: Unexpected `%c` in object";
          goto LAB_0012f8bd;
        }
        local_f8 = local_188;
        local_178 = uVar18;
        ppuVar12 = __ctype_b_loc();
        uVar18 = local_178;
        if ((*(byte *)((long)*ppuVar12 + (long)(char)bVar10 * 2 + 1) & 8) == 0) {
          if (bVar10 != 0x2b) {
            if (uVar28 != 0x2e) {
              if (uVar28 == 0x2d) goto LAB_0012e9a0;
              goto LAB_0012efcb;
            }
            if (jVar1 == json_integer) {
              if (local_180 == 0) {
                uVar17 = local_168._88_8_ & 0xffffffff;
                uVar18 = (ulong)local_168.cur_col;
                pcVar20 = "%d:%d: Expected digit before `.`";
                goto LAB_0012f79f;
              }
              local_f8->type = json_double;
              (local_f8->u).dbl = (double)(local_f8->u).integer;
              goto LAB_0012f1c4;
            }
            if ((uVar24 >> 10 & 1) == 0) goto LAB_0012f134;
LAB_0012f1d2:
            if (local_180 == 0) {
              uVar17 = local_168._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_168.cur_col;
              pcVar20 = "%d:%d: Expected digit after `e`";
              goto LAB_0012f79f;
            }
            lVar13 = -local_f0;
            if ((uVar24 >> 0xc & 1) == 0) {
              lVar13 = local_f0;
            }
            dVar3 = pow(10.0,(double)lVar13);
            (local_f8->u).dbl = dVar3 * (local_f8->u).dbl;
LAB_0012f222:
            if ((uVar24 >> 8 & 1) != 0) {
              if (local_f8->type == json_integer) {
                (local_f8->u).integer = -(local_f8->u).integer;
              }
              else {
                (local_f8->u).integer = (local_f8->u).integer ^ 0x8000000000000000;
              }
            }
            goto LAB_0012f246;
          }
LAB_0012e9a0:
          if ((uVar24 & 0xc00) == 0x400) {
            uVar24 = (uint)(bVar10 == 0x2d) << 0xc | uVar24 | 0x800;
            goto LAB_0012f01c;
          }
LAB_0012efcb:
          if ((uVar24 >> 10 & 1) != 0) goto LAB_0012f1d2;
          if (jVar1 == json_double) {
LAB_0012f134:
            if (local_180 == 0) {
              uVar17 = local_168._88_8_ & 0xffffffff;
              uVar18 = (ulong)local_168.cur_col;
              pcVar20 = "%d:%d: Expected digit after `.`";
              goto LAB_0012f79f;
            }
            local_e0 = (double)local_e8;
            dVar3 = pow(10.0,(double)local_180);
            (local_f8->u).dbl = local_e0 / dVar3 + (local_f8->u).dbl;
          }
          if ((bVar10 & 0xdf) != 0x45) goto LAB_0012f222;
          if (local_f8->type == json_integer) {
            local_f8->type = json_double;
            (local_f8->u).dbl = (double)(local_f8->u).integer;
          }
          uVar24 = uVar24 & 0xfffff977 | 0x400;
LAB_0012f1c4:
          local_180 = 0;
          uVar18 = local_178;
        }
        else {
          lVar13 = local_180 + 1;
          lVar16 = (long)(int)uVar26;
          if ((jVar1 != json_integer) && ((uVar24 & 0x400) == 0)) {
            local_e8 = lVar16 + local_e8 * 10 + -0x30;
            local_180 = lVar13;
            goto LAB_0012f01c;
          }
          if ((uVar24 >> 10 & 1) == 0) {
            if ((uVar24 >> 9 & 1) != 0) {
              uVar18 = local_168._88_8_ & 0xffffffff;
              uVar17 = (ulong)local_168.cur_col;
              pcVar20 = "%d:%d: Unexpected `0` before `%c`";
              goto LAB_0012f8bd;
            }
            uVar26 = uVar24 | 0x200;
            if (bVar10 != 0x30) {
              uVar26 = uVar24;
            }
            if (local_180 == 0) {
              uVar24 = uVar26;
            }
            (local_f8->u).integer = lVar16 + (local_f8->u).integer * 10 + -0x30;
            local_180 = lVar13;
          }
          else {
            uVar24 = uVar24 | 0x800;
            local_f0 = lVar16 + local_f0 * 10 + -0x30;
            local_180 = lVar13;
          }
        }
      }
      else {
        if (bVar10 == 9) goto LAB_0012f01c;
        if (uVar28 == 0x5d) {
          if ((local_188 == (json_value *)0x0) || (local_188->type != json_array)) {
            uVar17 = local_168._88_8_ & 0xffffffff;
            uVar18 = (ulong)local_168.cur_col;
            pcVar20 = "%d:%d: Unexpected ]";
            goto LAB_0012f79f;
          }
LAB_0012eea9:
          uVar22 = (uVar24 & 0xffffff72) + 1;
          bVar5 = true;
          goto LAB_0012f24a;
        }
        if ((uVar28 == 0xd) || (uVar28 == 0x20)) goto LAB_0012f01c;
        if (uVar28 == 10) goto LAB_0012eafa;
        if ((uVar24 & 4) != 0) {
          if (bVar10 == 0x2c) {
            uVar24 = uVar24 & 0xffffff7b;
            goto LAB_0012f01c;
          }
          uVar18 = local_168._88_8_ & 0xffffffff;
          uVar17 = (ulong)local_168.cur_col;
          pcVar20 = "%d:%d: Expected , before %c";
          goto LAB_0012f8bd;
        }
        if ((uVar24 & 0x40) != 0) {
          if (bVar10 == 0x3a) {
            uVar24 = uVar24 & 0xffffff3b;
            goto LAB_0012f01c;
          }
          uVar18 = local_168._88_8_ & 0xffffffff;
          uVar17 = (ulong)local_168.cur_col;
          pcVar20 = "%d:%d: Expected : before %c";
          goto LAB_0012f8bd;
        }
        uVar22 = uVar24 & 0xffffff33;
        if (bVar10 == 0x22) {
          iVar11 = new_value(&local_168,&local_188,&local_170,&local_100,json_string);
          if (iVar11 == 0) goto LAB_0012fa19;
          uVar24 = uVar22 | 0x20;
          local_198 = (_json_value *)(local_188->u).object.values;
          uVar18 = 0;
          goto LAB_0012f01c;
        }
        if (uVar28 == 0x5b) {
          iVar11 = new_value(&local_168,&local_188,&local_170,&local_100,json_array);
          if (iVar11 == 0) goto LAB_0012fa19;
          goto LAB_0012f01c;
        }
        if (uVar28 == 0x66) {
          if ((((3 < (long)pbVar19 - (long)pbVar27) &&
               (local_168.ptr = (char *)(pbVar27 + 1), pbVar27[1] == 0x61)) &&
              (local_168.ptr = (char *)(pbVar27 + 2), pbVar27[2] == 0x6c)) &&
             ((local_168.ptr = (char *)(pbVar27 + 3), pbVar27[3] == 0x73 &&
              (local_168.ptr = (char *)(pbVar27 + 4), pbVar27[4] == 0x65)))) {
            jVar1 = json_boolean;
LAB_0012f58a:
            iVar11 = new_value(&local_168,&local_188,&local_170,&local_100,jVar1);
            if (iVar11 != 0) goto LAB_0012f5a4;
            goto LAB_0012fa19;
          }
LAB_0012f977:
          uVar17 = local_168._88_8_ & 0xffffffff;
          uVar18 = (ulong)local_168.cur_col;
          pcVar20 = "%d:%d: Unknown value";
          goto LAB_0012f79f;
        }
        if (uVar28 == 0x6e) {
          if (((2 < (long)pbVar19 - (long)pbVar27) &&
              (local_168.ptr = (char *)(pbVar27 + 1), pbVar27[1] == 0x75)) &&
             ((local_168.ptr = (char *)(pbVar27 + 2), pbVar27[2] == 0x6c &&
              (local_168.ptr = (char *)(pbVar27 + 3), pbVar27[3] == 0x6c)))) {
            jVar1 = json_null;
            goto LAB_0012f58a;
          }
          goto LAB_0012f977;
        }
        if (uVar28 == 0x74) {
          if (((((long)pbVar19 - (long)pbVar27 < 3) ||
               (local_168.ptr = (char *)(pbVar27 + 1), pbVar27[1] != 0x72)) ||
              (local_168.ptr = (char *)(pbVar27 + 2), pbVar27[2] != 0x75)) ||
             (local_168.ptr = (char *)(pbVar27 + 3), pbVar27[3] != 0x65)) goto LAB_0012f977;
          iVar11 = new_value(&local_168,&local_188,&local_170,&local_100,json_boolean);
          if (iVar11 == 0) goto LAB_0012fa19;
          (local_188->u).boolean = 1;
LAB_0012f5a4:
          bVar5 = true;
          goto LAB_0012f24a;
        }
        if (uVar28 == 0x7b) {
          local_178 = uVar18;
          iVar11 = new_value(&local_168,&local_188,&local_170,&local_100,json_object);
          uVar18 = local_178;
          uVar24 = uVar22;
          if (iVar11 != 0) goto LAB_0012f01c;
LAB_0012fa19:
          error[0x12] = 'f';
          error[0x13] = 'a';
          error[0x14] = 'i';
          error[0x15] = 'l';
          error[0x16] = 'u';
          error[0x17] = 'r';
          error[0x18] = 'e';
          error[0x19] = '\0';
          builtin_strncpy(error + 8,"llocation ",10);
          error[0] = 'M';
          error[1] = 'e';
          error[2] = 'm';
          error[3] = 'o';
          error[4] = 'r';
          error[5] = 'y';
          error[6] = ' ';
          error[7] = 'a';
          goto LAB_0012f7b3;
        }
        local_178 = uVar18;
        ppuVar12 = __ctype_b_loc();
        if (((*(byte *)((long)*ppuVar12 + (long)(char)bVar10 * 2 + 1) & 8) == 0) && (bVar10 != 0x2d)
           ) {
          uVar18 = local_168._88_8_ & 0xffffffff;
          uVar17 = (ulong)local_168._88_8_ >> 0x20;
          pcVar20 = "%d:%d: Unexpected %c when seeking value";
          goto LAB_0012f8bd;
        }
        iVar11 = new_value(&local_168,&local_188,&local_170,&local_100,json_integer);
        if (iVar11 == 0) goto LAB_0012fa19;
        if (local_168.first_pass != 0) {
          uVar18 = local_178;
          if (bVar10 != 0x2d) {
            uVar22 = uVar24 & 0xffffe033 | 2;
            local_180 = 0;
            local_f0 = 0;
            local_e8 = 0;
            goto LAB_0012f24a;
          }
          uVar24 = uVar24 & 0xffffe033 | 0x100;
          local_180 = 0;
          local_f0 = 0;
          local_e8 = 0;
          goto LAB_0012f01c;
        }
        while (((((*ppuVar12)[(char)uVar28] >> 0xb & 1) != 0 ||
                ((uVar28 - 0x2b < 0x3b &&
                 ((0x40000000400000dU >> ((ulong)(uVar28 - 0x2b) & 0x3f) & 1) != 0)))) &&
               (local_168.ptr = local_168.ptr + 1, (byte *)local_168.ptr != pbVar19))) {
          uVar28 = (uint)(byte)*local_168.ptr;
        }
LAB_0012f246:
        bVar5 = true;
        uVar18 = local_178;
        uVar22 = uVar22 | 3;
LAB_0012f24a:
        if ((uVar22 & 2) != 0) {
          uVar22 = uVar22 & 0xfffffffd;
          local_168.ptr = local_168.ptr + -1;
        }
        uVar24 = uVar22;
        if (bVar5) {
          p_Var23 = local_188->parent;
          if (p_Var23 == (_json_value *)0x0) {
            bVar5 = false;
            uVar24 = uVar22 & 0xfffffffa | 0x84;
          }
          else {
            jVar1 = p_Var23->type;
            if (local_168.first_pass == 0) {
              if (jVar1 == json_array) {
                *(json_value **)((p_Var23->u).string.ptr + (ulong)(p_Var23->u).string.length * 8) =
                     local_188;
                p_Var23 = local_188->parent;
              }
              else if (jVar1 == json_object) {
                (p_Var23->u).object.values[(p_Var23->u).string.length].value = local_188;
              }
            }
            uVar24 = (p_Var23->u).boolean + 1;
            (p_Var23->u).string.length = uVar24;
            if (local_168.uint_max < uVar24) goto LAB_0012f789;
            bVar5 = false;
            local_188 = local_188->parent;
            uVar24 = (uint)(jVar1 == json_array) << 3 | uVar22 & 0xfffffffa | 4;
          }
        }
      }
      goto LAB_0012f01c;
    }
    if (bVar10 == 9) goto LAB_0012f01c;
    if (uVar28 == 10) {
LAB_0012eafa:
      local_168.cur_col = 0;
      local_168.cur_line = local_168.cur_line + 1;
      goto LAB_0012f01c;
    }
    if ((uVar28 == 0xd) || (uVar28 == 0x20)) goto LAB_0012f01c;
    if (uVar28 != 0) {
      uVar18 = local_168._88_8_ & 0xffffffff;
      uVar17 = (ulong)local_168.cur_col;
      pcVar20 = "%d:%d: Trailing garbage: `%c`";
LAB_0012f8bd:
      snprintf(error,0x80,pcVar20,uVar18,uVar17,(ulong)uVar26);
LAB_0012f7b3:
      if (local_c0 != (char *)0x0) {
        if (error[0] == '\0') {
          builtin_strncpy(local_c0,"Unknown error",0xe);
        }
        else {
          strcpy(local_c0,error);
        }
      }
      pvVar7 = local_168.settings.user_data;
      p_Var6 = local_168.settings.memory_free;
      iVar11 = local_168.first_pass;
      ppjVar15 = &local_170;
      if (local_168.first_pass == 0) {
        ppjVar15 = &local_100;
      }
      pjVar25 = *ppjVar15;
      while (pjVar25 != (json_value *)0x0) {
        pjVar2 = (json_value *)(pjVar25->_reserved).object_mem;
        (*p_Var6)(pjVar25,pvVar7);
        pjVar25 = pjVar2;
      }
      if (iVar11 == 0) {
        json_value_free_ex(&local_168.settings,local_170);
      }
      return (json_value *)0x0;
    }
    local_100 = local_170;
    iVar11 = local_168.first_pass + -1;
  } while( true );
}

Assistant:

json_value * json_parse_ex (json_settings * settings,
                            const json_char * json,
                            size_t length,
                            char * error_buf)
{
   json_char error [json_error_max];
   const json_char * end;
   json_value *top, *root = NULL, * alloc = 0;
   json_state state = EMPTY_STATE_STRUCT;
   long flags;
   long num_digits = 0, num_e = 0;
   json_int_t num_fraction = 0;

   /* Skip UTF-8 BOM
    */
   if (length >= 3 && ((unsigned char) json [0]) == 0xEF
                   && ((unsigned char) json [1]) == 0xBB
                   && ((unsigned char) json [2]) == 0xBF)
   {
      json += 3;
      length -= 3;
   }

   error[0] = '\0';
   end = (json + length);

   memcpy (&state.settings, settings, sizeof (json_settings));

   if (!state.settings.memory_alloc)
      state.settings.memory_alloc = default_alloc;

   if (!state.settings.memory_free)
      state.settings.memory_free = default_free;

   memset (&state.uint_max, 0xFF, sizeof (state.uint_max));
   memset (&state.ulong_max, 0xFF, sizeof (state.ulong_max));

   state.uint_max -= 8; /* limit of how much can be added before next check */
   state.ulong_max -= 8;

   for (state.first_pass = 1; state.first_pass >= 0; -- state.first_pass)
   {
      json_uchar uchar;
      unsigned char uc_b1, uc_b2, uc_b3, uc_b4;
      json_char * string = 0;
      unsigned int string_length = 0;

      top = root = 0;
      flags = flag_seek_value;

      state.cur_line = 1;

      for (state.ptr = json ;; ++ state.ptr)
      {
         json_char b = (state.ptr == end ? 0 : *state.ptr);

         if (flags & flag_string)
         {
            if (!b)
            {  snprintf (error, sizeof(error), "Unexpected EOF in string (at %d:%d)", line_and_col);
               goto e_failed;
            }

            if (string_length > state.uint_max)
               goto e_overflow;

            if (flags & flag_escaped)
            {
               flags &= ~ flag_escaped;

               switch (b)
               {
                  case 'b':  string_add ('\b');  break;
                  case 'f':  string_add ('\f');  break;
                  case 'n':  string_add ('\n');  break;
                  case 'r':  string_add ('\r');  break;
                  case 't':  string_add ('\t');  break;
                  case 'u':

                    if (end - state.ptr < 4 ||
                        (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                        (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                    {
                        snprintf (error, sizeof(error), "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                        goto e_failed;
                    }

                    uc_b1 = (uc_b1 << 4) | uc_b2;
                    uc_b2 = (uc_b3 << 4) | uc_b4;
                    uchar = (uc_b1 << 8) | uc_b2;

                    if ((uchar & 0xF800) == 0xD800) {
                        json_uchar uchar2;

                        if (end - state.ptr < 6 || (*++ state.ptr) != '\\' || (*++ state.ptr) != 'u' ||
                            (uc_b1 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b2 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b3 = hex_value (*++ state.ptr)) == 0xFF ||
                            (uc_b4 = hex_value (*++ state.ptr)) == 0xFF)
                        {
                            snprintf (error, sizeof(error), "Invalid character value `%c` (at %d:%d)", b, line_and_col);
                            goto e_failed;
                        }

                        uc_b1 = (uc_b1 << 4) | uc_b2;
                        uc_b2 = (uc_b3 << 4) | uc_b4;
                        uchar2 = (uc_b1 << 8) | uc_b2;

                        uchar = 0x010000 | ((uchar & 0x3FF) << 10) | (uchar2 & 0x3FF);
                    }

                    if (sizeof (json_char) >= sizeof (json_uchar) || (uchar <= 0x7F))
                    {
                       string_add ((json_char) uchar);
                       break;
                    }

                    if (uchar <= 0x7FF)
                    {
                        if (state.first_pass)
                           string_length += 2;
                        else
                        {  string [string_length ++] = 0xC0 | (uchar >> 6);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (uchar <= 0xFFFF) {
                        if (state.first_pass)
                           string_length += 3;
                        else
                        {  string [string_length ++] = 0xE0 | (uchar >> 12);
                           string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                           string [string_length ++] = 0x80 | (uchar & 0x3F);
                        }

                        break;
                    }

                    if (state.first_pass)
                       string_length += 4;
                    else
                    {  string [string_length ++] = 0xF0 | (uchar >> 18);
                       string [string_length ++] = 0x80 | ((uchar >> 12) & 0x3F);
                       string [string_length ++] = 0x80 | ((uchar >> 6) & 0x3F);
                       string [string_length ++] = 0x80 | (uchar & 0x3F);
                    }

                    break;

                  default:
                     string_add (b);
               };

               continue;
            }

            if (b == '\\')
            {
               flags |= flag_escaped;
               continue;
            }

            if (b == '"')
            {
               if (!state.first_pass)
                  string [string_length] = 0;

               flags &= ~ flag_string;
               string = 0;

               switch (top->type)
               {
                  case json_string:

                     top->u.string.length = string_length;
                     flags |= flag_next;

                     break;

                  case json_object:

                     if (state.first_pass)
                        (*(json_char **) &top->u.object.values) += string_length + 1;
                     else
                     {
                        top->u.object.values [top->u.object.length].name
                           = (json_char *) top->_reserved.object_mem;

                        top->u.object.values [top->u.object.length].name_length
                           = string_length;

                        (*(json_char **) &top->_reserved.object_mem) += string_length + 1;
                     }

                     flags |= flag_seek_value | flag_need_colon;
                     continue;

                  default:
                     break;
               };
            }
            else
            {
               string_add (b);
               continue;
            }
         }

         if (state.settings.settings & json_enable_comments)
         {
            if (flags & (flag_line_comment | flag_block_comment))
            {
               if (flags & flag_line_comment)
               {
                  if (b == '\r' || b == '\n' || !b)
                  {
                     flags &= ~ flag_line_comment;
                     -- state.ptr;  /* so null can be reproc'd */
                  }

                  continue;
               }

               if (flags & flag_block_comment)
               {
                  if (!b)
                  {  snprintf (error, sizeof(error), "%d:%d: Unexpected EOF in block comment", line_and_col);
                     goto e_failed;
                  }

                  if (b == '*' && state.ptr < (end - 1) && state.ptr [1] == '/')
                  {
                     flags &= ~ flag_block_comment;
                     ++ state.ptr;  /* skip closing sequence */
                  }

                  continue;
               }
            }
            else if (b == '/')
            {
               if (! (flags & (flag_seek_value | flag_done)) && top->type != json_object)
               {  snprintf (error, sizeof(error), "%d:%d: Comment not allowed here", line_and_col);
                  goto e_failed;
               }

               if (++ state.ptr == end)
               {  snprintf (error, sizeof(error), "%d:%d: EOF unexpected", line_and_col);
                  goto e_failed;
               }

               switch (b = *state.ptr)
               {
                  case '/':
                     flags |= flag_line_comment;
                     continue;

                  case '*':
                     flags |= flag_block_comment;
                     continue;

                  default:
                     snprintf (error, sizeof(error), "%d:%d: Unexpected `%c` in comment opening sequence", line_and_col, b);
                     goto e_failed;
               };
            }
         }

         if (flags & flag_done)
         {
            if (!b)
               break;

            switch (b)
            {
               whitespace:
                  continue;

               default:

                  snprintf (error, sizeof(error), "%d:%d: Trailing garbage: `%c`",
                           state.cur_line, state.cur_col, b);

                  goto e_failed;
            };
         }

         if (flags & flag_seek_value)
         {
            switch (b)
            {
               whitespace:
                  continue;

               case ']':

                  if (top && top->type == json_array)
                     flags = (flags & ~ (flag_need_comma | flag_seek_value)) | flag_next;
                  else
                  {  snprintf (error, sizeof(error), "%d:%d: Unexpected ]", line_and_col);
                     goto e_failed;
                  }

                  break;

               default:

                  if (flags & flag_need_comma)
                  {
                     if (b == ',')
                     {  flags &= ~ flag_need_comma;
                        continue;
                     }
                     else
                     {
                        snprintf (error, sizeof(error), "%d:%d: Expected , before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  if (flags & flag_need_colon)
                  {
                     if (b == ':')
                     {  flags &= ~ flag_need_colon;
                        continue;
                     }
                     else
                     {
                        snprintf (error, sizeof(error), "%d:%d: Expected : before %c",
                                 state.cur_line, state.cur_col, b);

                        goto e_failed;
                     }
                  }

                  flags &= ~ flag_seek_value;

                  switch (b)
                  {
                     case '{':

                        if (!new_value (&state, &top, &root, &alloc, json_object))
                           goto e_alloc_failure;

                        continue;

                     case '[':

                        if (!new_value (&state, &top, &root, &alloc, json_array))
                           goto e_alloc_failure;

                        flags |= flag_seek_value;
                        continue;

                     case '"':

                        if (!new_value (&state, &top, &root, &alloc, json_string))
                           goto e_alloc_failure;

                        flags |= flag_string;

                        string = top->u.string.ptr;
                        string_length = 0;

                        continue;

                     case 't':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'r' ||
                            *(++ state.ptr) != 'u' || *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        top->u.boolean = 1;

                        flags |= flag_next;
                        break;

                     case 'f':

                        if ((end - state.ptr) < 4 || *(++ state.ptr) != 'a' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 's' ||
                            *(++ state.ptr) != 'e')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_boolean))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     case 'n':

                        if ((end - state.ptr) < 3 || *(++ state.ptr) != 'u' ||
                            *(++ state.ptr) != 'l' || *(++ state.ptr) != 'l')
                        {
                           goto e_unknown_value;
                        }

                        if (!new_value (&state, &top, &root, &alloc, json_null))
                           goto e_alloc_failure;

                        flags |= flag_next;
                        break;

                     default:

                        if (isdigit (b) || b == '-')
                        {
                           if (!new_value (&state, &top, &root, &alloc, json_integer))
                              goto e_alloc_failure;

                           if (!state.first_pass)
                           {
                              while (isdigit (b) || b == '+' || b == '-'
                                        || b == 'e' || b == 'E' || b == '.')
                              {
                                 if ( (++ state.ptr) == end)
                                 {
                                    b = 0;
                                    break;
                                 }

                                 b = *state.ptr;
                              }

                              flags |= flag_next | flag_reproc;
                              break;
                           }

                           flags &= ~ (flag_num_negative | flag_num_e |
                                        flag_num_e_got_sign | flag_num_e_negative |
                                           flag_num_zero);

                           num_digits = 0;
                           num_fraction = 0;
                           num_e = 0;

                           if (b != '-')
                           {
                              flags |= flag_reproc;
                              break;
                           }

                           flags |= flag_num_negative;
                           continue;
                        }
                        else
                        {  snprintf (error, sizeof(error), "%d:%d: Unexpected %c when seeking value", line_and_col, b);
                           goto e_failed;
                        }
                  };
            };
         }
         else
         {
            switch (top->type)
            {
            case json_object:

               switch (b)
               {
                  whitespace:
                     continue;

                  case '"':

                     if (flags & flag_need_comma)
                     {  snprintf (error, sizeof(error), "%d:%d: Expected , before \"", line_and_col);
                        goto e_failed;
                     }

                     flags |= flag_string;

                     string = (json_char *) top->_reserved.object_mem;
                     string_length = 0;

                     break;

                  case '}':

                     flags = (flags & ~ flag_need_comma) | flag_next;
                     break;

                  case ',':

                     if (flags & flag_need_comma)
                     {
                        flags &= ~ flag_need_comma;
                        break;
                     }

                  default:
                     snprintf (error, sizeof(error), "%d:%d: Unexpected `%c` in object", line_and_col, b);
                     goto e_failed;
               };

               break;

            case json_integer:
            case json_double:

               if (isdigit (b))
               {
                  ++ num_digits;

                  if (top->type == json_integer || flags & flag_num_e)
                  {
                     if (! (flags & flag_num_e))
                     {
                        if (flags & flag_num_zero)
                        {  snprintf (error, sizeof(error), "%d:%d: Unexpected `0` before `%c`", line_and_col, b);
                           goto e_failed;
                        }

                        if (num_digits == 1 && b == '0')
                           flags |= flag_num_zero;
                     }
                     else
                     {
                        flags |= flag_num_e_got_sign;
                        num_e = (num_e * 10) + (b - '0');
                        continue;
                     }

                     top->u.integer = (top->u.integer * 10) + (b - '0');
                     continue;
                  }

                  num_fraction = (num_fraction * 10) + (b - '0');
                  continue;
               }

               if (b == '+' || b == '-')
               {
                  if ( (flags & flag_num_e) && !(flags & flag_num_e_got_sign))
                  {
                     flags |= flag_num_e_got_sign;

                     if (b == '-')
                        flags |= flag_num_e_negative;

                     continue;
                  }
               }
               else if (b == '.' && top->type == json_integer)
               {
                  if (!num_digits)
                  {  snprintf (error, sizeof(error), "%d:%d: Expected digit before `.`", line_and_col);
                     goto e_failed;
                  }

                  top->type = json_double;
                  top->u.dbl = (double) top->u.integer;

                  num_digits = 0;
                  continue;
               }

               if (! (flags & flag_num_e))
               {
                  if (top->type == json_double)
                  {
                     if (!num_digits)
                     {  snprintf (error, sizeof(error), "%d:%d: Expected digit after `.`", line_and_col);
                        goto e_failed;
                     }

                     top->u.dbl += ((double) num_fraction) / (pow (10.0, (double) num_digits));
                  }

                  if (b == 'e' || b == 'E')
                  {
                     flags |= flag_num_e;

                     if (top->type == json_integer)
                     {
                        top->type = json_double;
                        top->u.dbl = (double) top->u.integer;
                     }

                     num_digits = 0;
                     flags &= ~ flag_num_zero;

                     continue;
                  }
               }
               else
               {
                  if (!num_digits)
                  {  snprintf (error, sizeof(error), "%d:%d: Expected digit after `e`", line_and_col);
                     goto e_failed;
                  }

                  top->u.dbl *= pow (10.0, (double)
                      (flags & flag_num_e_negative ? - num_e : num_e));
               }

               if (flags & flag_num_negative)
               {
                  if (top->type == json_integer)
                     top->u.integer = - top->u.integer;
                  else
                     top->u.dbl = - top->u.dbl;
               }

               flags |= flag_next | flag_reproc;
               break;

            default:
               break;
            };
         }

         if (flags & flag_reproc)
         {
            flags &= ~ flag_reproc;
            -- state.ptr;
         }

         if (flags & flag_next)
         {
            flags = (flags & ~ flag_next) | flag_need_comma;

            if (!top->parent)
            {
               /* root value done */

               flags |= flag_done;
               continue;
            }

            if (top->parent->type == json_array)
               flags |= flag_seek_value;

            if (!state.first_pass)
            {
               json_value * parent = top->parent;

               switch (parent->type)
               {
                  case json_object:

                     parent->u.object.values
                        [parent->u.object.length].value = top;

                     break;

                  case json_array:

                     parent->u.array.values
                           [parent->u.array.length] = top;

                     break;

                  default:
                     break;
               };
            }

            if ( (++ top->parent->u.array.length) > state.uint_max)
               goto e_overflow;

            top = top->parent;

            continue;
         }
      }

      alloc = root;
   }

   return root;

e_unknown_value:

   snprintf (error, sizeof(error), "%d:%d: Unknown value", line_and_col);
   goto e_failed;

e_alloc_failure:

   strcpy (error, "Memory allocation failure");
   goto e_failed;

e_overflow:

   snprintf (error, sizeof(error), "%d:%d: Too long (caught overflow)", line_and_col);
   goto e_failed;

e_failed:

   if (error_buf)
   {
      if (*error)
         strcpy (error_buf, error);
      else
         strcpy (error_buf, "Unknown error");
   }

   if (state.first_pass)
      alloc = root;

   while (alloc)
   {
      top = alloc->_reserved.next_alloc;
      state.settings.memory_free (alloc, state.settings.user_data);
      alloc = top;
   }

   if (!state.first_pass)
      json_value_free_ex (&state.settings, root);

   return 0;
}